

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void ossl_provider_cleanup(Curl_easy *data)

{
  Curl_easy *data_local;
  
  if ((data->state).baseprov != (void *)0x0) {
    OSSL_PROVIDER_unload((data->state).baseprov);
    (data->state).baseprov = (void *)0x0;
  }
  if ((data->state).provider != (void *)0x0) {
    OSSL_PROVIDER_unload((data->state).provider);
    (data->state).provider = (void *)0x0;
  }
  OSSL_LIB_CTX_free((data->state).libctx);
  (data->state).libctx = (void *)0x0;
  (*Curl_cfree)((data->state).propq);
  (data->state).propq = (char *)0x0;
  (data->state).field_0x188 = (data->state).field_0x188 & 0xfe;
  return;
}

Assistant:

static void ossl_provider_cleanup(struct Curl_easy *data)
{
  if(data->state.baseprov) {
    OSSL_PROVIDER_unload(data->state.baseprov);
    data->state.baseprov = NULL;
  }
  if(data->state.provider) {
    OSSL_PROVIDER_unload(data->state.provider);
    data->state.provider = NULL;
  }
  OSSL_LIB_CTX_free(data->state.libctx);
  data->state.libctx = NULL;
  Curl_safefree(data->state.propq);
  data->state.provider_loaded = FALSE;
}